

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

vector<duckdb::LogicalType,_true> * duckdb::GetContinuousQuantileTypes(void)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_139;
  LogicalType local_138 [24];
  LogicalType local_120 [24];
  LogicalType local_108 [24];
  LogicalType local_f0 [24];
  LogicalType local_d8 [24];
  LogicalType local_c0 [24];
  LogicalType local_a8 [24];
  LogicalType local_90 [24];
  LogicalType local_78 [24];
  LogicalType local_60 [24];
  LogicalType local_48 [24];
  LogicalType local_30 [24];
  
  duckdb::LogicalType::LogicalType(local_138,TINYINT);
  duckdb::LogicalType::LogicalType(local_120,SMALLINT);
  duckdb::LogicalType::LogicalType(local_108,INTEGER);
  duckdb::LogicalType::LogicalType(local_f0,BIGINT);
  duckdb::LogicalType::LogicalType(local_d8,HUGEINT);
  duckdb::LogicalType::LogicalType(local_c0,FLOAT);
  duckdb::LogicalType::LogicalType(local_a8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_90,DATE);
  duckdb::LogicalType::LogicalType(local_78,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_60,TIME);
  duckdb::LogicalType::LogicalType(local_48,TIMESTAMP_TZ);
  duckdb::LogicalType::LogicalType(local_30,TIME_TZ);
  __l._M_len = 0xc;
  __l._M_array = local_138;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_139);
  lVar1 = 0x108;
  do {
    duckdb::LogicalType::~LogicalType(local_138 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

vector<LogicalType> GetContinuousQuantileTypes() {
	return {LogicalType::TINYINT,   LogicalType::SMALLINT, LogicalType::INTEGER,      LogicalType::BIGINT,
	        LogicalType::HUGEINT,   LogicalType::FLOAT,    LogicalType::DOUBLE,       LogicalType::DATE,
	        LogicalType::TIMESTAMP, LogicalType::TIME,     LogicalType::TIMESTAMP_TZ, LogicalType::TIME_TZ};
}